

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTVisitor.h
# Opt level: O0

pool_ptr<soul::AST::VariableDeclaration> __thiscall
soul::RewritingASTVisitor::visitAs<soul::AST::VariableDeclaration>
          (RewritingASTVisitor *this,pool_ptr<soul::AST::VariableDeclaration> *o)

{
  bool bVar1;
  VariableDeclaration *pVVar2;
  pool_ptr<soul::AST::VariableDeclaration> *in_RDX;
  pool_ptr<soul::AST::VariableDeclaration> local_28 [2];
  pool_ptr<soul::AST::VariableDeclaration> *o_local;
  RewritingASTVisitor *this_local;
  
  o_local = o;
  this_local = this;
  bVar1 = pool_ptr<soul::AST::VariableDeclaration>::operator==(in_RDX,(void *)0x0);
  if (bVar1) {
    pool_ptr<soul::AST::VariableDeclaration>::pool_ptr
              ((pool_ptr<soul::AST::VariableDeclaration> *)this);
  }
  else {
    local_28[0].object = in_RDX->object;
    bVar1 = is_type<soul::AST::VariableDeclaration,soul::AST::VariableDeclaration>(local_28);
    checkAssertion(bVar1,"is_type<Type> (o)","visitAs",0x1cd);
    pool_ptr<soul::AST::VariableDeclaration>::~pool_ptr(local_28);
    pVVar2 = pool_ptr<soul::AST::VariableDeclaration>::operator*(in_RDX);
    pVVar2 = (VariableDeclaration *)visitObject((RewritingASTVisitor *)o,&pVVar2->super_Statement);
    pool_ptr<soul::AST::VariableDeclaration>::pool_ptr<soul::AST::VariableDeclaration,void>
              ((pool_ptr<soul::AST::VariableDeclaration> *)this,pVVar2);
  }
  return (pool_ptr<soul::AST::VariableDeclaration>)(VariableDeclaration *)this;
}

Assistant:

pool_ptr<Type> visitAs (pool_ptr<Type> o)
    {
        if (o == nullptr)
            return {};

        SOUL_ASSERT (is_type<Type> (o));
        return static_cast<Type&> (visitObject (*o));
    }